

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_dispatch.cpp
# Opt level: O1

void __kmp_dispatch_init<unsigned_int>
               (ident_t *loc,int gtid,sched_type schedule,uint lb,uint ub,signed_t st,signed_t chunk
               ,int push_ws)

{
  kmp_int32 *pkVar1;
  int iVar2;
  kmp_info_t *pkVar3;
  kmp_team_p *pkVar4;
  kmp_disp_t *pkVar5;
  ident_t *piVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  uint uVar12;
  uint uVar13;
  sched_type *psVar14;
  code *pcVar15;
  ulong uVar16;
  kmp_info_t *pkVar17;
  kmp_uint32 kVar18;
  code *pcVar19;
  void *obj;
  uint uVar20;
  uint uVar21;
  char *pcVar22;
  cons_type ct;
  void *pvVar23;
  void *pvVar24;
  kmp_uint64 sched_type;
  int iVar25;
  uint uVar27;
  void *iterations;
  sched_type sVar28;
  sched_type sVar29;
  sched_type sVar30;
  dispatch_private_info_t *pdVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  uint local_128;
  ulong local_110;
  dispatch_shared_info_t *local_b0;
  int local_a0;
  kmp_msg_t local_78;
  kmp_msg_t local_60;
  kmp_msg_t local_48;
  uint uVar26;
  
  if (__kmp_init_parallel == 0) {
    __kmp_parallel_initialize();
  }
  pkVar17 = (kmp_info_t *)__kmp_threads;
  pkVar3 = __kmp_threads[gtid];
  pkVar4 = (pkVar3->th).th_team;
  iVar2 = (pkVar4->t).t_serialized;
  (pkVar3->th).th_ident = loc;
  bVar34 = false;
  if ((__kmp_itt_metadata_add_ptr__3_0 != (__kmp_itt_metadata_add_t *)0x0) &&
     (__kmp_forkjoin_frames_mode == 3)) {
    pkVar17 = *(kmp_info_t **)((long)pkVar17 + (long)gtid * 8);
    if ((*(int *)(pkVar17->th_pad + 0x20) == 0) &&
       ((pkVar3->th).th_teams_microtask == (microtask_t)0x0)) {
      bVar34 = (pkVar4->t).t_active_level == 1;
      pkVar17 = (kmp_info_t *)CONCAT71((int7)((ulong)pkVar17 >> 8),bVar34);
    }
    else {
      bVar34 = false;
    }
  }
  local_128 = (uint)pkVar17;
  pkVar5 = (pkVar3->th).th_dispatch;
  if (iVar2 == 0) {
    local_128 = pkVar5->th_disp_index;
    pkVar5->th_disp_index = local_128 + 1;
    pdVar31 = ((pkVar3->th).th_dispatch)->th_disp_buffer +
              (ulong)local_128 % (ulong)(uint)__kmp_dispatch_num_buffers;
    local_b0 = (pkVar4->t).t_disp_buffer +
               (ulong)local_128 % (ulong)(uint)__kmp_dispatch_num_buffers;
  }
  else {
    pdVar31 = pkVar5->th_disp_buffer;
  }
  sVar28 = schedule & ~(kmp_sch_modifier_nonmonotonic|kmp_sch_modifier_monotonic);
  if (sVar28 - kmp_nm_lower < 0x28) {
    pdVar31->nomerge = 1;
    sVar28 = sVar28 - 0x80;
  }
  else {
    pdVar31->nomerge = 0;
  }
  pdVar31->type_size = 4;
  if ((sVar28 & kmp_ord_lower) == 0) {
    pdVar31->ordered = 0;
  }
  else {
    pdVar31->ordered = 1;
    sVar28 = sVar28 - kmp_sch_lower;
  }
  if (sVar28 == kmp_sch_runtime) {
    sVar29 = (pkVar4->t).t_sched.r_sched_type;
    if (sVar29 == kmp_sch_default) {
      psVar14 = &__kmp_static;
LAB_0015567e:
      sVar29 = *psVar14;
    }
    else if (sVar29 == kmp_sch_guided_chunked) {
      psVar14 = &__kmp_guided;
      goto LAB_0015567e;
    }
    uVar13 = (pkVar4->t).t_sched.chunk;
    pvVar23 = (void *)(ulong)uVar13;
    local_110 = (ulong)(int)uVar13;
LAB_0015568a:
    if (sVar29 == kmp_sch_auto) {
      sVar29 = __kmp_auto;
    }
    if ((0x100000 < (pkVar4->t).t_nproc) && (sVar29 == kmp_sch_guided_analytical_chunked)) {
      __kmp_msg_format(&local_48,kmp_i18n_msg_DispatchManyThreads);
      __kmp_msg(kmp_ms_warning);
      sVar29 = kmp_sch_guided_iterative_chunked;
    }
    (pdVar31->u).p32.field_6.parm1 = (kmp_int32)pvVar23;
    sVar30 = sVar29;
  }
  else {
    pvVar23 = (void *)(ulong)(uint)chunk;
    local_110 = (ulong)chunk;
    sVar29 = __kmp_guided;
    if ((sVar28 == kmp_sch_guided_chunked) ||
       (sVar29 = sVar28, sVar30 = __kmp_static, sVar28 != kmp_sch_default)) {
      if (chunk < 2) {
        pvVar23 = (void *)0x1;
      }
      goto LAB_0015568a;
    }
  }
  uVar13 = sVar30 - kmp_sch_static_chunked;
  if (0xc < uVar13) {
    __kmp_debug_assert("assertion failure",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-openmp-runtime/src/kmp_dispatch.cpp"
                       ,0x2ff);
  }
  (pdVar31->u).p32.count = 0;
  if ((st == 0) && (__kmp_env_consistency_check != 0)) {
    __kmp_error_construct
              (kmp_i18n_msg_CnsLoopIncrZeroProhibited,ct_pdo_ordered - (pdVar31->ordered == 0),loc);
  }
  if (st == 1) {
    uVar27 = ub - lb;
    if (ub < lb) goto LAB_001557a4;
LAB_001557b9:
    iterations = (void *)(ulong)(uVar27 + 1);
  }
  else {
    if (st < 0) {
      if (lb < ub) goto LAB_001557a4;
      uVar27 = (lb - ub) / (uint)-st;
      goto LAB_001557b9;
    }
    if (lb <= ub) {
      uVar27 = (ub - lb) / (uint)st;
      goto LAB_001557b9;
    }
LAB_001557a4:
    iterations = (void *)0x0;
  }
  (pdVar31->u).p32.lb = lb;
  (pdVar31->u).p32.ub = ub;
  (pdVar31->u).p32.st = st;
  uVar27 = (uint)iterations;
  (pdVar31->u).p32.tc = uVar27;
  if (iVar2 == 0) {
    if (pdVar31->ordered == 0) {
      pcVar15 = __kmp_dispatch_dxo_error;
      pcVar19 = __kmp_dispatch_deo_error;
    }
    else {
      pdVar31->ordered_bumped = 0;
      (pdVar31->u).p64.field_6.parm1 = 1;
      pcVar15 = __kmp_dispatch_dxo<unsigned_int>;
      pcVar19 = __kmp_dispatch_deo<unsigned_int>;
    }
    ((pkVar3->th).th_dispatch)->th_deo_fcn = pcVar19;
    ((pkVar3->th).th_dispatch)->th_dxo_fcn = pcVar15;
  }
  if (__kmp_env_consistency_check != 0) {
    ct = ct_pdo_ordered - (pdVar31->ordered == 0);
    if (push_ws == 0) {
      __kmp_check_workshare(gtid,ct,loc);
      ct = ct_none;
    }
    else {
      __kmp_push_workshare(gtid,ct,loc);
    }
    pdVar31->pushed_ws = ct;
  }
  if (0xb < uVar13) {
switchD_0015589c_caseD_1:
    __kmp_msg_format(&local_60,kmp_i18n_msg_UnknownSchedTypeDetected);
    __kmp_msg_format(&local_78,kmp_i18n_hnt_GetNewerLibrary);
    obj = (void *)__kmp_msg_null._16_8_;
    __kmp_msg(kmp_ms_fatal);
    goto LAB_00155bca;
  }
  obj = (void *)((long)&switchD_0015589c::switchdataD_0016d5cc +
                (long)(int)(&switchD_0015589c::switchdataD_0016d5cc)[uVar13]);
  uVar12 = (uint)pvVar23;
  switch(uVar13) {
  case 0:
  case 2:
    if ((pdVar31->u).p32.field_6.parm1 == 0) {
      (pdVar31->u).p32.field_6.parm1 = 1;
    }
    goto LAB_00155bca;
  default:
    goto switchD_0015589c_caseD_1;
  case 6:
    uVar13 = (pkVar4->t).t_nproc * 2;
    obj = (void *)((ulong)iterations / (ulong)uVar13);
    if (uVar27 < uVar13) {
      obj = (void *)0x1;
    }
    uVar13 = (uint)obj;
    pvVar24 = obj;
    if (uVar12 < uVar13) {
      pvVar24 = pvVar23;
    }
    iVar25 = (int)pvVar24;
    if (uVar12 == 0) {
      iVar25 = 1;
    }
    uVar12 = ((iVar25 + uVar13 + uVar27 * 2) - 1) / (iVar25 + uVar13);
    uVar27 = 2;
    if (2 < uVar12) {
      uVar27 = uVar12;
    }
    (pdVar31->u).p32.field_6.parm1 = iVar25;
    (pdVar31->u).p32.field_6.parm2 = uVar13;
    (pdVar31->u).p32.field_6.parm3 = uVar27;
    (pdVar31->u).p32.field_6.parm4 = (uVar13 - iVar25) / (uVar27 - 1);
    sVar30 = kmp_sch_trapezoidal;
    goto LAB_00155bca;
  case 7:
    uVar13 = (pkVar4->t).t_nproc;
    obj = (void *)(ulong)uVar13;
    if (1 < (int)uVar13) {
      uVar27 = ((uVar27 + uVar13) - 1) / uVar13;
    }
    (pdVar31->u).p32.field_6.parm1 = uVar27;
    goto LAB_00155bba;
  case 8:
    break;
  case 9:
    uVar16 = (ulong)(uint)(pkVar4->t).t_nproc;
    if (1 < uVar16) {
      obj = (void *)(((long)(int)uVar12 * 2 + 1) * uVar16);
      sVar30 = kmp_sch_dynamic_chunked;
      if ((long)obj < (long)iterations) {
        uVar13 = (uVar12 * 2 + 2) * (pkVar4->t).t_nproc;
        obj = (void *)(ulong)uVar13;
        (pdVar31->u).p32.field_6.parm2 = uVar13;
        *(double *)((long)&pdVar31->u + 0x28) = 0.5 / (double)uVar16;
        sVar30 = kmp_sch_guided_iterative_chunked;
      }
      goto LAB_00155bca;
    }
    goto LAB_00155a9b;
  case 10:
    uVar16 = (ulong)(uint)(pkVar4->t).t_nproc;
    if (1 < uVar16) {
      sVar30 = kmp_sch_dynamic_chunked;
      obj = iterations;
      if ((long)iterations <= (long)(((long)(int)uVar12 * 2 + 1) * uVar16)) goto LAB_00155bca;
      dVar8 = 1.0;
      dVar7 = -0.5 / (double)uVar16 + 1.0;
      *(double *)((long)&pdVar31->u + 0x28) = dVar7;
      uVar13 = 0xe5;
      dVar9 = dVar7;
      do {
        dVar10 = dVar8 * dVar9;
        if ((uVar13 & 1) == 0) {
          dVar10 = dVar8;
        }
        dVar8 = dVar10;
        dVar9 = dVar9 * dVar9;
        bVar32 = 1 < uVar13;
        uVar13 = uVar13 >> 1;
      } while (bVar32);
      dVar9 = (((double)(int)uVar12 + (double)(int)uVar12 + 1.0) * (double)uVar16) /
              (double)(long)iterations;
      if (dVar8 <= dVar9) {
        uVar21 = 0xe5;
        uVar13 = 0;
      }
      else {
        uVar21 = 0xe5;
        do {
          uVar13 = uVar21;
          dVar8 = dVar8 * dVar8;
          uVar21 = uVar13 * 2;
          if (dVar8 <= dVar9) break;
        } while (uVar21 < 0x8000000);
        uVar13 = uVar13 & 0x7fffffff;
      }
      while (uVar26 = uVar13, uVar26 + 1 < uVar21) {
        uVar13 = uVar21 + uVar26 >> 1;
        dVar8 = 1.0;
        if (1 < uVar21 + uVar26) {
          uVar16 = (ulong)uVar13;
          dVar10 = dVar7;
          dVar11 = 1.0;
          do {
            dVar8 = dVar11 * dVar10;
            if ((uVar16 & 1) == 0) {
              dVar8 = dVar11;
            }
            dVar10 = dVar10 * dVar10;
            uVar20 = (uint)uVar16;
            uVar16 = uVar16 >> 1;
            dVar11 = dVar8;
          } while (1 < uVar20);
        }
        if (dVar8 <= dVar9) {
          uVar21 = uVar13;
          uVar13 = uVar26;
        }
      }
      if (uVar21 == 0) {
LAB_00155f2a:
        __kmp_debug_assert("assertion failure",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-openmp-runtime/src/kmp_dispatch.cpp"
                           ,0x42b);
      }
      else {
        dVar8 = 1.0;
        if (uVar21 - 1 != 0) {
          uVar13 = uVar21 - 1;
          dVar10 = dVar7;
          dVar11 = 1.0;
          do {
            dVar8 = dVar11 * dVar10;
            if ((uVar13 & 1) == 0) {
              dVar8 = dVar11;
            }
            dVar10 = dVar10 * dVar10;
            bVar32 = 1 < uVar13;
            uVar13 = uVar13 >> 1;
            dVar11 = dVar8;
          } while (bVar32);
        }
        if (dVar8 <= dVar9) goto LAB_00155f2a;
        uVar16 = (ulong)uVar21;
        dVar8 = dVar7;
        dVar10 = 1.0;
        do {
          dVar11 = dVar10 * dVar8;
          if ((uVar16 & 1) == 0) {
            dVar11 = dVar10;
          }
          dVar8 = dVar8 * dVar8;
          uVar13 = (uint)uVar16;
          uVar16 = uVar16 >> 1;
          dVar10 = dVar11;
        } while (1 < uVar13);
        if (dVar9 < dVar11) goto LAB_00155f2a;
      }
      (pdVar31->u).p32.field_6.parm2 = uVar21;
      dVar8 = 1.0;
      if (uVar21 != 0) {
        uVar16 = (ulong)uVar21;
        dVar9 = 1.0;
        do {
          dVar8 = dVar9 * dVar7;
          if ((uVar16 & 1) == 0) {
            dVar8 = dVar9;
          }
          dVar7 = dVar7 * dVar7;
          uVar13 = (uint)uVar16;
          uVar16 = uVar16 >> 1;
          dVar9 = dVar8;
        } while (1 < uVar13);
      }
      dVar8 = (double)(long)iterations * dVar8;
      local_a0 = (int)(long)ROUND(dVar8);
      bVar32 = dVar8 != (double)((long)ROUND(dVar8) & 0xffffffff);
      obj = (void *)(ulong)bVar32;
      (pdVar31->u).p32.count = (uVar27 - (uVar21 * uVar12 + local_a0)) - (uint)bVar32;
      sVar30 = kmp_sch_guided_analytical_chunked;
      goto LAB_00155bca;
    }
LAB_00155a9b:
    (pdVar31->u).p32.field_6.parm1 = uVar27;
LAB_00155bba:
    sVar30 = kmp_sch_static_greedy;
    goto LAB_00155bca;
  case 0xb:
    uVar13 = (pkVar4->t).t_nproc;
    uVar12 = ((int)((ulong)iterations / (ulong)pvVar23) + 1) -
             (uint)((int)((ulong)iterations % (ulong)pvVar23) == 0);
    bVar32 = uVar13 < 2;
    bVar33 = uVar12 < uVar13;
    obj = (void *)CONCAT71((int7)((ulong)obj >> 8),bVar33 || bVar32);
    sVar30 = kmp_sch_static_balanced;
    if (!bVar33 && !bVar32) {
      uVar21 = *(uint *)(__kmp_threads[gtid]->th_pad + 0x20);
      uVar20 = uVar12 % uVar13;
      uVar26 = uVar20;
      if (uVar21 < uVar20) {
        uVar26 = uVar21;
      }
      iVar25 = uVar26 + (uVar12 / uVar13) * uVar21;
      (pdVar31->u).p32.count = iVar25;
      (pdVar31->u).p32.ub = iVar25 + uVar12 / uVar13 + (uint)(uVar21 < uVar20);
      (pdVar31->u).p32.field_6.parm2 = lb;
      (pdVar31->u).p32.field_6.parm4 = uVar21;
      (pdVar31->u).p32.st = st;
      sVar30 = kmp_sch_static_steal;
    }
    if (!bVar33 && !bVar32) goto LAB_00155bca;
  }
  uVar13 = (pkVar4->t).t_nproc;
  if (uVar13 < 2) {
    if (uVar27 == 0) {
      (pdVar31->u).p32.count = 1;
      (pdVar31->u).p32.field_6.parm1 = 0;
      goto LAB_00155bca;
    }
    obj = (void *)(ulong)(uVar27 - 1);
    (pdVar31->u).p32.field_6.parm1 = 1;
    uVar27 = 0;
  }
  else {
    uVar12 = *(uint *)(__kmp_threads[gtid]->th_pad + 0x20);
    obj = (void *)(ulong)uVar12;
    if (uVar27 < uVar13) {
      if (uVar12 < uVar27) {
        bVar33 = uVar12 == uVar27 - 1;
        bVar32 = true;
        uVar27 = uVar12;
      }
      else {
        (pdVar31->u).p32.count = 1;
        bVar33 = false;
        bVar32 = false;
      }
    }
    else {
      iVar25 = (int)((ulong)iterations / (ulong)uVar13);
      uVar21 = (uint)((ulong)iterations % (ulong)uVar13);
      uVar27 = uVar21;
      if (uVar12 < uVar21) {
        uVar27 = uVar12;
      }
      uVar27 = uVar27 + iVar25 * uVar12;
      bVar33 = uVar12 == uVar13 - 1;
      bVar32 = true;
      obj = (void *)(ulong)(iVar25 + uVar27 + -1 + (uint)(uVar12 < uVar21));
    }
    *(uint *)((long)&pdVar31->u + 0x20) = (uint)bVar33;
    if (!bVar32) goto LAB_00155bca;
  }
  kVar18 = (kmp_uint32)obj;
  if (bVar34) {
    local_110 = (ulong)((kVar18 - uVar27) + 1);
  }
  if (st == 1) {
    (pdVar31->u).p32.lb = uVar27 + lb;
    uVar13 = lb + kVar18;
  }
  else {
    uVar13 = kVar18 * st + lb;
    (pdVar31->u).p32.lb = uVar27 * st + lb;
    if (st < 1) {
      if (uVar13 + st < ub) {
        uVar13 = ub;
      }
    }
    else if (ub < uVar13 + st) {
      uVar13 = ub;
    }
  }
  (pdVar31->u).p32.ub = uVar13;
  if (pdVar31->ordered != 0) {
    (pdVar31->u).p32.ordered_lower = uVar27;
    (pdVar31->u).p32.ordered_upper = kVar18;
  }
LAB_00155bca:
  pdVar31->schedule = sVar30;
  if (iVar2 == 0) {
    __kmp_wait_yield<unsigned_int>(&local_b0->buffer_index,local_128,__kmp_eq<unsigned_int>,obj);
    ((pkVar3->th).th_dispatch)->th_dispatch_pr_current = pdVar31;
    ((pkVar3->th).th_dispatch)->th_dispatch_sh_current = local_b0;
    if ((pdVar31->ordered != 0) && (__kmp_itt_sync_create_ptr__3_0 != (undefined1 *)0x0)) {
      piVar6 = (__kmp_threads[gtid]->th).th_ident;
      if (piVar6 == (ident_t *)0x0) {
        pcVar22 = (char *)0x0;
      }
      else {
        pcVar22 = piVar6->psource;
      }
      (*(code *)__kmp_itt_sync_create_ptr__3_0)
                (((__kmp_threads[gtid]->th).th_dispatch)->th_dispatch_sh_current,"OMP Ordered",
                 pcVar22,0);
    }
    if (bVar34) {
      switch(sVar30) {
      case kmp_sch_static_chunked:
      case kmp_sch_static_balanced:
        sched_type = 0;
        break;
      default:
        sched_type = 3;
        break;
      case kmp_sch_dynamic_chunked:
        sched_type = 1;
        break;
      case kmp_sch_static_greedy:
        local_110 = (ulong)(uint)(pdVar31->u).p32.field_6.parm1;
        sched_type = 0;
        break;
      case kmp_sch_guided_iterative_chunked:
      case kmp_sch_guided_analytical_chunked:
        sched_type = 2;
      }
      __kmp_itt_metadata_loop(loc,sched_type,(kmp_uint64)iterations,local_110);
    }
  }
  if (sVar30 == kmp_sch_static_steal) {
    pkVar1 = &(pdVar31->u).p32.static_steal_counter;
    *pkVar1 = *pkVar1 + 1;
  }
  return;
}

Assistant:

static void
__kmp_dispatch_init(
    ident_t                        * loc,
    int                              gtid,
    enum sched_type                  schedule,
    T                                lb,
    T                                ub,
    typename traits_t< T >::signed_t st,
    typename traits_t< T >::signed_t chunk,
    int                              push_ws
) {
    typedef typename traits_t< T >::unsigned_t  UT;
    typedef typename traits_t< T >::signed_t    ST;
    typedef typename traits_t< T >::floating_t  DBL;
    static const int ___kmp_size_type = sizeof( UT );

    int                                            active;
    T                                              tc;
    kmp_info_t *                                   th;
    kmp_team_t *                                   team;
    kmp_uint32                                     my_buffer_index;
    dispatch_private_info_template< T >          * pr;
    dispatch_shared_info_template< UT > volatile * sh;

    KMP_BUILD_ASSERT( sizeof( dispatch_private_info_template< T > ) == sizeof( dispatch_private_info ) );
    KMP_BUILD_ASSERT( sizeof( dispatch_shared_info_template< UT > ) == sizeof( dispatch_shared_info ) );

    if ( ! TCR_4( __kmp_init_parallel ) )
        __kmp_parallel_initialize();

#if INCLUDE_SSC_MARKS
    SSC_MARK_DISPATCH_INIT();
#endif
    #ifdef KMP_DEBUG
    {
        const char * buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init: T#%%d called: schedule:%%d chunk:%%%s lb:%%%s ub:%%%s st:%%%s\n",
            traits_t< ST >::spec, traits_t< T >::spec, traits_t< T >::spec, traits_t< ST >::spec );
        KD_TRACE(10, ( buff, gtid, schedule, chunk, lb, ub, st ) );
        __kmp_str_free( &buff );
    }
    #endif
    /* setup data */
    th     = __kmp_threads[ gtid ];
    team   = th -> th.th_team;
    active = ! team -> t.t_serialized;
    th->th.th_ident = loc;

#if USE_ITT_BUILD
    kmp_uint64 cur_chunk = chunk;
    int itt_need_metadata_reporting = __itt_metadata_add_ptr && __kmp_forkjoin_frames_mode == 3 &&
        KMP_MASTER_GTID(gtid) &&
#if OMP_40_ENABLED
        th->th.th_teams_microtask == NULL &&
#endif
        team->t.t_active_level == 1;
#endif
    if ( ! active ) {
        pr = reinterpret_cast< dispatch_private_info_template< T >* >
            ( th -> th.th_dispatch -> th_disp_buffer ); /* top of the stack */
    } else {
        KMP_DEBUG_ASSERT( th->th.th_dispatch ==
                &th->th.th_team->t.t_dispatch[th->th.th_info.ds.ds_tid] );

        my_buffer_index = th->th.th_dispatch->th_disp_index ++;

        /* What happens when number of threads changes, need to resize buffer? */
        pr = reinterpret_cast< dispatch_private_info_template< T >  * >
            ( &th -> th.th_dispatch -> th_disp_buffer[ my_buffer_index % __kmp_dispatch_num_buffers ] );
        sh = reinterpret_cast< dispatch_shared_info_template< UT > volatile * >
            ( &team -> t.t_disp_buffer[ my_buffer_index % __kmp_dispatch_num_buffers ] );
    }

    /* Currently just ignore the monotonic and non-monotonic modifiers (the compiler isn't producing them
     * yet anyway).
     * When it is we'll want to look at them somewhere here and use that information to add to our
     * schedule choice. We shouldn't need to pass them on, they merely affect which schedule we can
     * legally choose for various dynamic cases. (In paritcular, whether or not a stealing scheme is legal).
     */
    schedule = SCHEDULE_WITHOUT_MODIFIERS(schedule);

    /* Pick up the nomerge/ordered bits from the scheduling type */
    if ( (schedule >= kmp_nm_lower) && (schedule < kmp_nm_upper) ) {
        pr->nomerge = TRUE;
        schedule = (enum sched_type)(((int)schedule) - (kmp_nm_lower - kmp_sch_lower));
    } else {
        pr->nomerge = FALSE;
    }
    pr->type_size = ___kmp_size_type; // remember the size of variables
    if ( kmp_ord_lower & schedule ) {
        pr->ordered = TRUE;
        schedule = (enum sched_type)(((int)schedule) - (kmp_ord_lower - kmp_sch_lower));
    } else {
        pr->ordered = FALSE;
    }

    if ( schedule == kmp_sch_static ) {
        schedule = __kmp_static;
    } else {
        if ( schedule == kmp_sch_runtime ) {
            // Use the scheduling specified by OMP_SCHEDULE (or __kmp_sch_default if not specified)
            schedule = team -> t.t_sched.r_sched_type;
            // Detail the schedule if needed (global controls are differentiated appropriately)
            if ( schedule == kmp_sch_guided_chunked ) {
                schedule = __kmp_guided;
            } else if ( schedule == kmp_sch_static ) {
                schedule = __kmp_static;
            }
            // Use the chunk size specified by OMP_SCHEDULE (or default if not specified)
            chunk = team -> t.t_sched.chunk;
#if USE_ITT_BUILD
            cur_chunk = chunk;
#endif
            #ifdef KMP_DEBUG
            {
                const char * buff;
                // create format specifiers before the debug output
                buff = __kmp_str_format(
                    "__kmp_dispatch_init: T#%%d new: schedule:%%d chunk:%%%s\n",
                    traits_t< ST >::spec );
                KD_TRACE(10, ( buff, gtid, schedule, chunk ) );
                __kmp_str_free( &buff );
            }
            #endif
        } else {
            if ( schedule == kmp_sch_guided_chunked ) {
                schedule = __kmp_guided;
            }
            if ( chunk <= 0 ) {
                chunk = KMP_DEFAULT_CHUNK;
            }
        }

        if ( schedule == kmp_sch_auto ) {
            // mapping and differentiation: in the __kmp_do_serial_initialize()
            schedule = __kmp_auto;
            #ifdef KMP_DEBUG
            {
                const char * buff;
                // create format specifiers before the debug output
                buff = __kmp_str_format(
                    "__kmp_dispatch_init: kmp_sch_auto: T#%%d new: schedule:%%d chunk:%%%s\n",
                    traits_t< ST >::spec );
                KD_TRACE(10, ( buff, gtid, schedule, chunk ) );
                __kmp_str_free( &buff );
            }
            #endif
        }

        /* guided analytical not safe for too many threads */
        if ( team->t.t_nproc > 1<<20 && schedule == kmp_sch_guided_analytical_chunked ) {
            schedule = kmp_sch_guided_iterative_chunked;
            KMP_WARNING( DispatchManyThreads );
        }
        pr->u.p.parm1 = chunk;
    }
    KMP_ASSERT2( (kmp_sch_lower < schedule && schedule < kmp_sch_upper),
                "unknown scheduling type" );

    pr->u.p.count = 0;

    if ( __kmp_env_consistency_check ) {
        if ( st == 0 ) {
            __kmp_error_construct(
                kmp_i18n_msg_CnsLoopIncrZeroProhibited,
                ( pr->ordered ? ct_pdo_ordered : ct_pdo ), loc
            );
        }
    }
    // compute trip count
    if ( st == 1 ) {   // most common case
        if ( ub >= lb ) {
            tc = ub - lb + 1;
        } else {   // ub < lb
            tc = 0;            // zero-trip
        }
    } else if ( st < 0 ) {
        if ( lb >= ub ) {
            // AC: cast to unsigned is needed for loops like (i=2B; i>-2B; i-=1B),
            //     where the division needs to be unsigned regardless of the result type
            tc = (UT)(lb - ub) / (-st) + 1;
        } else {   // lb < ub
            tc = 0;            // zero-trip
        }
    } else {       // st > 0
        if ( ub >= lb ) {
            // AC: cast to unsigned is needed for loops like (i=-2B; i<2B; i+=1B),
            //     where the division needs to be unsigned regardless of the result type
            tc = (UT)(ub - lb) / st + 1;
        } else {   // ub < lb
            tc = 0;            // zero-trip
        }
    }

    // Any half-decent optimizer will remove this test when the blocks are empty since the macros expand to nothing
    // when statistics are disabled.
    if (schedule == __kmp_static)
    {
        KMP_COUNT_BLOCK(OMP_FOR_static);
        KMP_COUNT_VALUE(FOR_static_iterations, tc);
    }
    else
    {
        KMP_COUNT_BLOCK(OMP_FOR_dynamic);
        KMP_COUNT_VALUE(FOR_dynamic_iterations, tc);
    }

    pr->u.p.lb = lb;
    pr->u.p.ub = ub;
    pr->u.p.st = st;
    pr->u.p.tc = tc;

    #if KMP_OS_WINDOWS
    pr->u.p.last_upper = ub + st;
    #endif /* KMP_OS_WINDOWS */

    /* NOTE: only the active parallel region(s) has active ordered sections */

    if ( active ) {
        if ( pr->ordered == 0 ) {
            th -> th.th_dispatch -> th_deo_fcn = __kmp_dispatch_deo_error;
            th -> th.th_dispatch -> th_dxo_fcn = __kmp_dispatch_dxo_error;
        } else {
            pr->ordered_bumped = 0;

            pr->u.p.ordered_lower = 1;
            pr->u.p.ordered_upper = 0;

            th -> th.th_dispatch -> th_deo_fcn = __kmp_dispatch_deo< UT >;
            th -> th.th_dispatch -> th_dxo_fcn = __kmp_dispatch_dxo< UT >;
        }
    }

    if ( __kmp_env_consistency_check ) {
        enum cons_type ws = pr->ordered ? ct_pdo_ordered : ct_pdo;
        if ( push_ws ) {
            __kmp_push_workshare( gtid, ws, loc );
            pr->pushed_ws = ws;
        } else {
            __kmp_check_workshare( gtid, ws, loc );
            pr->pushed_ws = ct_none;
        }
    }

    switch ( schedule ) {
    #if  ( KMP_STATIC_STEAL_ENABLED && KMP_ARCH_X86_64 )
    case kmp_sch_static_steal:
        {
            T nproc = team->t.t_nproc;
            T ntc, init;

            KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_static_steal case\n", gtid ) );

            ntc = (tc % chunk ? 1 : 0) + tc / chunk;
            if ( nproc > 1 && ntc >= nproc ) {
                T id = __kmp_tid_from_gtid(gtid);
                T small_chunk, extras;

                small_chunk = ntc / nproc;
                extras = ntc % nproc;

                init = id * small_chunk + ( id < extras ? id : extras );
                pr->u.p.count = init;
                pr->u.p.ub = init + small_chunk + ( id < extras ? 1 : 0 );

                pr->u.p.parm2 = lb;
                //pr->pfields.parm3 = 0; // it's not used in static_steal
                pr->u.p.parm4 = id;
                pr->u.p.st = st;
                break;
            } else {
                KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to kmp_sch_static_balanced\n",
                               gtid ) );
                schedule = kmp_sch_static_balanced;
                /* too few iterations: fall-through to kmp_sch_static_balanced */
            } // if
            /* FALL-THROUGH to static balanced */
        } // case
    #endif
    case kmp_sch_static_balanced:
        {
            T nproc = team->t.t_nproc;
            T init, limit;

            KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_static_balanced case\n",
                            gtid ) );

            if ( nproc > 1 ) {
                T id = __kmp_tid_from_gtid(gtid);

                if ( tc < nproc ) {
                    if ( id < tc ) {
                        init = id;
                        limit = id;
                        pr->u.p.parm1 = (id == tc - 1);  /* parm1 stores *plastiter */
                    } else {
                        pr->u.p.count = 1;  /* means no more chunks to execute */
                        pr->u.p.parm1 = FALSE;
                        break;
                    }
                } else {
                    T small_chunk = tc / nproc;
                    T extras = tc % nproc;
                    init = id * small_chunk + (id < extras ? id : extras);
                    limit = init + small_chunk - (id < extras ? 0 : 1);
                    pr->u.p.parm1 = (id == nproc - 1);
                }
            } else {
                if ( tc > 0 ) {
                    init = 0;
                    limit = tc - 1;
                    pr->u.p.parm1 = TRUE;
                } else {
                    // zero trip count
                    pr->u.p.count = 1;  /* means no more chunks to execute */
                    pr->u.p.parm1 = FALSE;
                    break;
                }
            }
#if USE_ITT_BUILD
            // Calculate chunk for metadata report
            if ( itt_need_metadata_reporting )
                cur_chunk = limit - init + 1;
#endif
            if ( st == 1 ) {
                pr->u.p.lb = lb + init;
                pr->u.p.ub = lb + limit;
            } else {
                T ub_tmp = lb + limit * st;   // calculated upper bound, "ub" is user-defined upper bound
                pr->u.p.lb = lb + init * st;
                // adjust upper bound to "ub" if needed, so that MS lastprivate will match it exactly
                if ( st > 0 ) {
                    pr->u.p.ub = ( ub_tmp + st > ub ? ub : ub_tmp );
                } else {
                    pr->u.p.ub = ( ub_tmp + st < ub ? ub : ub_tmp );
                }
            }
            if ( pr->ordered ) {
                pr->u.p.ordered_lower = init;
                pr->u.p.ordered_upper = limit;
            }
            break;
        } // case
    case kmp_sch_guided_iterative_chunked :
        {
            T nproc = team->t.t_nproc;
            KD_TRACE(100,("__kmp_dispatch_init: T#%d kmp_sch_guided_iterative_chunked case\n",gtid));

            if ( nproc > 1 ) {
                if ( (2L * chunk + 1 ) * nproc >= tc ) {
                    /* chunk size too large, switch to dynamic */
                    schedule = kmp_sch_dynamic_chunked;
                } else {
                    // when remaining iters become less than parm2 - switch to dynamic
                    pr->u.p.parm2 = guided_int_param * nproc * ( chunk + 1 );
                    *(double*)&pr->u.p.parm3 = guided_flt_param / nproc;   // may occupy parm3 and parm4
                }
            } else {
                KD_TRACE(100,("__kmp_dispatch_init: T#%d falling-through to kmp_sch_static_greedy\n",gtid));
                schedule = kmp_sch_static_greedy;
                /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
                KD_TRACE(100,("__kmp_dispatch_init: T#%d kmp_sch_static_greedy case\n",gtid));
                pr->u.p.parm1 = tc;
            } // if
        } // case
        break;
    case kmp_sch_guided_analytical_chunked:
        {
            T nproc = team->t.t_nproc;
            KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_guided_analytical_chunked case\n", gtid));

            if ( nproc > 1 ) {
                if ( (2L * chunk + 1 ) * nproc >= tc ) {
                    /* chunk size too large, switch to dynamic */
                    schedule = kmp_sch_dynamic_chunked;
                } else {
                    /* commonly used term: (2 nproc - 1)/(2 nproc) */
                    DBL x;

                    #if KMP_OS_WINDOWS && KMP_ARCH_X86
                    /* Linux* OS already has 64-bit computation by default for
		       long double, and on Windows* OS on Intel(R) 64,
		       /Qlong_double doesn't work.  On Windows* OS
		       on IA-32 architecture, we need to set precision to
		       64-bit instead of the default 53-bit. Even though long
		       double doesn't work on Windows* OS on Intel(R) 64, the
		       resulting lack of precision is not expected to impact
		       the correctness of the algorithm, but this has not been
		       mathematically proven.
                    */
                    // save original FPCW and set precision to 64-bit, as
                    // Windows* OS on IA-32 architecture defaults to 53-bit
                    unsigned int oldFpcw = _control87(0,0);
                    _control87(_PC_64,_MCW_PC); // 0,0x30000
                    #endif
                    /* value used for comparison in solver for cross-over point */
                    long double target = ((long double)chunk * 2 + 1) * nproc / tc;

                    /* crossover point--chunk indexes equal to or greater than
		       this point switch to dynamic-style scheduling */
                    UT   cross;

                    /* commonly used term: (2 nproc - 1)/(2 nproc) */
                    x = (long double)1.0 - (long double)0.5 / nproc;

                    #ifdef KMP_DEBUG
                    { // test natural alignment
                        struct _test_a {
                            char a;
                            union {
                                char b;
                                DBL  d;
                            };
                        } t;
                        ptrdiff_t natural_alignment = (ptrdiff_t)&t.b - (ptrdiff_t)&t - (ptrdiff_t)1;
                        //__kmp_warn( " %llx %llx %lld", (long long)&t.d, (long long)&t, (long long)natural_alignment );
                        KMP_DEBUG_ASSERT( ( ( (ptrdiff_t)&pr->u.p.parm3 ) & ( natural_alignment ) ) == 0 );
                    }
                    #endif // KMP_DEBUG

                    /* save the term in thread private dispatch structure */
                    *(DBL*)&pr->u.p.parm3 = x;

                    /* solve for the crossover point to the nearest integer i for which C_i <= chunk */
                    {
                        UT          left, right, mid;
                        long double p;

                        /* estimate initial upper and lower bound */

                        /* doesn't matter what value right is as long as it is positive, but
                           it affects performance of the solver
                        */
                        right = 229;
                        p = __kmp_pow< UT >(x,right);
                        if ( p > target ) {
                            do{
                                p *= p;
                                right <<= 1;
                            } while(p>target && right < (1<<27));
                            left = right >> 1; /* lower bound is previous (failed) estimate of upper bound */
                        } else {
                            left = 0;
                        }

                        /* bisection root-finding method */
                        while ( left + 1 < right ) {
                            mid = (left + right) / 2;
                            if ( __kmp_pow< UT >(x,mid) > target ) {
                                left = mid;
                            } else {
                                right = mid;
                            }
                        } // while
                        cross = right;
                    }
                    /* assert sanity of computed crossover point */
                    KMP_ASSERT(cross && __kmp_pow< UT >(x, cross - 1) > target && __kmp_pow< UT >(x, cross) <= target);

                    /* save the crossover point in thread private dispatch structure */
                    pr->u.p.parm2 = cross;

                    // C75803
                    #if ( ( KMP_OS_LINUX || KMP_OS_WINDOWS ) && KMP_ARCH_X86 ) && ( ! defined( KMP_I8 ) )
                        #define GUIDED_ANALYTICAL_WORKAROUND (*( DBL * )&pr->u.p.parm3)
                    #else
                        #define GUIDED_ANALYTICAL_WORKAROUND (x)
                    #endif
                    /* dynamic-style scheduling offset */
                    pr->u.p.count = tc - __kmp_dispatch_guided_remaining(tc, GUIDED_ANALYTICAL_WORKAROUND, cross) - cross * chunk;
                    #if KMP_OS_WINDOWS && KMP_ARCH_X86
                        // restore FPCW
                        _control87(oldFpcw,_MCW_PC);
                    #endif
                } // if
            } else {
                KD_TRACE(100, ("__kmp_dispatch_init: T#%d falling-through to kmp_sch_static_greedy\n",
                               gtid ) );
                schedule = kmp_sch_static_greedy;
                /* team->t.t_nproc == 1: fall-through to kmp_sch_static_greedy */
                pr->u.p.parm1 = tc;
            } // if
        } // case
        break;
    case kmp_sch_static_greedy:
        KD_TRACE(100,("__kmp_dispatch_init: T#%d kmp_sch_static_greedy case\n",gtid));
            pr->u.p.parm1 = ( team -> t.t_nproc > 1 ) ?
                ( tc + team->t.t_nproc - 1 ) / team->t.t_nproc :
                tc;
        break;
    case kmp_sch_static_chunked :
    case kmp_sch_dynamic_chunked :
        if ( pr->u.p.parm1 <= 0 ) {
            pr->u.p.parm1 = KMP_DEFAULT_CHUNK;
        }
        KD_TRACE(100,("__kmp_dispatch_init: T#%d kmp_sch_static_chunked/kmp_sch_dynamic_chunked cases\n", gtid));
        break;
    case kmp_sch_trapezoidal :
        {
            /* TSS: trapezoid self-scheduling, minimum chunk_size = parm1 */

            T parm1, parm2, parm3, parm4;
            KD_TRACE(100, ("__kmp_dispatch_init: T#%d kmp_sch_trapezoidal case\n", gtid ) );

            parm1 = chunk;

            /* F : size of the first cycle */
            parm2 = ( tc / (2 * team->t.t_nproc) );

            if ( parm2 < 1 ) {
                parm2 = 1;
            }

            /* L : size of the last cycle.  Make sure the last cycle
             *     is not larger than the first cycle.
             */
            if ( parm1 < 1 ) {
                parm1 = 1;
            } else if ( parm1 > parm2 ) {
                parm1 = parm2;
            }

            /* N : number of cycles */
            parm3 = ( parm2 + parm1 );
            parm3 = ( 2 * tc + parm3 - 1) / parm3;

            if ( parm3 < 2 ) {
                parm3 = 2;
            }

            /* sigma : decreasing incr of the trapezoid */
            parm4 = ( parm3 - 1 );
            parm4 = ( parm2 - parm1 ) / parm4;

            // pointless check, because parm4 >= 0 always
            //if ( parm4 < 0 ) {
            //    parm4 = 0;
            //}

            pr->u.p.parm1 = parm1;
            pr->u.p.parm2 = parm2;
            pr->u.p.parm3 = parm3;
            pr->u.p.parm4 = parm4;
        } // case
        break;

    default:
        {
            __kmp_msg(
                kmp_ms_fatal,                        // Severity
                KMP_MSG( UnknownSchedTypeDetected ), // Primary message
                KMP_HNT( GetNewerLibrary ),          // Hint
                __kmp_msg_null                       // Variadic argument list terminator
            );
        }
        break;
    } // switch
    pr->schedule = schedule;
    if ( active ) {
        /* The name of this buffer should be my_buffer_index when it's free to use it */

        KD_TRACE(100, ("__kmp_dispatch_init: T#%d before wait: my_buffer_index:%d sh->buffer_index:%d\n",
                        gtid, my_buffer_index, sh->buffer_index) );
        __kmp_wait_yield< kmp_uint32 >( & sh->buffer_index, my_buffer_index, __kmp_eq< kmp_uint32 >
                                        USE_ITT_BUILD_ARG( NULL )
                                        );
            // Note: KMP_WAIT_YIELD() cannot be used there: buffer index and my_buffer_index are
            // *always* 32-bit integers.
        KMP_MB();  /* is this necessary? */
        KD_TRACE(100, ("__kmp_dispatch_init: T#%d after wait: my_buffer_index:%d sh->buffer_index:%d\n",
                        gtid, my_buffer_index, sh->buffer_index) );

        th -> th.th_dispatch -> th_dispatch_pr_current = (dispatch_private_info_t*) pr;
        th -> th.th_dispatch -> th_dispatch_sh_current = (dispatch_shared_info_t*)  sh;
#if USE_ITT_BUILD
        if ( pr->ordered ) {
            __kmp_itt_ordered_init( gtid );
        }; // if
        // Report loop metadata
        if ( itt_need_metadata_reporting ) {
            // Only report metadata by master of active team at level 1
            kmp_uint64 schedtype = 0;
            switch ( schedule ) {
            case kmp_sch_static_chunked:
            case kmp_sch_static_balanced:// Chunk is calculated in the switch above
                break;
            case kmp_sch_static_greedy:
                cur_chunk = pr->u.p.parm1;
                break;
            case kmp_sch_dynamic_chunked:
                schedtype = 1;
                break;
            case kmp_sch_guided_iterative_chunked:
            case kmp_sch_guided_analytical_chunked:
                schedtype = 2;
                break;
            default:
//            Should we put this case under "static"?
//            case kmp_sch_static_steal:
                schedtype = 3;
                break;
            }
            __kmp_itt_metadata_loop(loc, schedtype, tc, cur_chunk);
        }
#endif /* USE_ITT_BUILD */
    }; // if

    #ifdef KMP_DEBUG
    {
        const char * buff;
        // create format specifiers before the debug output
        buff = __kmp_str_format(
            "__kmp_dispatch_init: T#%%d returning: schedule:%%d ordered:%%%s lb:%%%s ub:%%%s" \
            " st:%%%s tc:%%%s count:%%%s\n\tordered_lower:%%%s ordered_upper:%%%s" \
            " parm1:%%%s parm2:%%%s parm3:%%%s parm4:%%%s\n",
            traits_t< UT >::spec, traits_t< T >::spec, traits_t< T >::spec,
            traits_t< ST >::spec, traits_t< UT >::spec, traits_t< UT >::spec,
            traits_t< UT >::spec, traits_t< UT >::spec, traits_t< T >::spec,
            traits_t< T >::spec, traits_t< T >::spec, traits_t< T >::spec );
        KD_TRACE(10, ( buff,
            gtid, pr->schedule, pr->ordered, pr->u.p.lb, pr->u.p.ub,
            pr->u.p.st, pr->u.p.tc, pr->u.p.count,
            pr->u.p.ordered_lower, pr->u.p.ordered_upper, pr->u.p.parm1,
            pr->u.p.parm2, pr->u.p.parm3, pr->u.p.parm4 ) );
        __kmp_str_free( &buff );
    }
    #endif
    #if ( KMP_STATIC_STEAL_ENABLED )
    if ( ___kmp_size_type < 8 ) {
      // It cannot be guaranteed that after execution of a loop with some other schedule kind
      // all the parm3 variables will contain the same value.
      // Even if all parm3 will be the same, it still exists a bad case like using 0 and 1
      // rather than program life-time increment.
      // So the dedicated variable is required. The 'static_steal_counter' is used.
      if( schedule == kmp_sch_static_steal ) {
        // Other threads will inspect this variable when searching for a victim.
        // This is a flag showing that other threads may steal from this thread since then.
        volatile T * p = &pr->u.p.static_steal_counter;
        *p = *p + 1;
      }
    }
    #endif // ( KMP_STATIC_STEAL_ENABLED && USE_STEALING )

#if OMPT_SUPPORT && OMPT_TRACE
    if (ompt_enabled &&
        ompt_callbacks.ompt_callback(ompt_event_loop_begin)) {
        ompt_team_info_t *team_info = __ompt_get_teaminfo(0, NULL);
        ompt_task_info_t *task_info = __ompt_get_taskinfo(0);
        ompt_callbacks.ompt_callback(ompt_event_loop_begin)(
            team_info->parallel_id, task_info->task_id, team_info->microtask);
    }
#endif
}